

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  TargetType targetType;
  char *__rhs;
  string *name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_70,&this->TargetLinkLanguage,"_");
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  __rhs = cmState::GetTargetTypeName(targetType);
  std::operator+(&local_50,&local_70,__rhs);
  std::operator+(&local_30,&local_50,"_DEVICE_LINKER__");
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                    GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_90,name);
  std::operator+(__return_storage_ptr__,&local_30,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule() const
{
  return this->TargetLinkLanguage + "_" +
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()) +
    "_DEVICE_LINKER__" + cmGlobalNinjaGenerator::EncodeRuleName(
                           this->GetGeneratorTarget()->GetName());
}